

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

char * next_boundary(char *startp,char *endp,char *b,size_t blen,int need_crlf)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (endp < startp + uVar2 + blen + 2) {
      return (char *)0x0;
    }
    if (((startp[uVar2] == '-') && (startp[uVar2 + 1] == '-')) &&
       (iVar1 = bcmp(startp + uVar2 + 2,b,blen), iVar1 == 0)) {
      if (need_crlf == 0) {
        return startp + uVar2 + 2;
      }
      if (((1 < uVar2) && (startp[uVar2 - 2] == '\r')) && (startp[uVar2 - 1] == '\n')) {
        return startp + uVar2 + 2;
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static const char *next_boundary(const char *startp, const char *endp,
                                 const char *b, size_t blen, int need_crlf)
{
    /* scan for the next boundary */
    for (const char *p = startp ; p + 2 + blen <= endp ; ++p)
    {
        /* check for a match */
        if (p[0] != '-' || p[1] != '-' || memcmp(p+2, b, blen) != 0)
            continue;

        /* if we need a newline prefix, check that it's there */
        if (need_crlf && (p < startp + 2 || p[-2] != '\r' || p[-1] != '\n'))
            continue;

        /* it's a match - return the part after the '--' prefix */
        return p + 2;
    }

    /* didn't find it */
    return 0;
}